

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.h
# Opt level: O3

uint8_t * quicly_encode_ack_frequency_frame
                    (uint8_t *dst,uint64_t sequence,uint64_t packet_tolerance,uint64_t max_ack_delay
                    ,int ignore_order)

{
  uint8_t *in_RAX;
  uint8_t *puVar1;
  uint8_t *puVar2;
  
  dst[0] = '@';
  dst[1] = 0xaf;
  puVar1 = dst + 2;
  if (0x3f < sequence) {
    if (sequence < 0x4000) {
      dst[2] = (byte)(sequence >> 8) | 0x40;
      puVar1 = dst + 3;
    }
    else {
      quicly_encode_ack_frequency_frame_cold_1();
      puVar1 = in_RAX;
    }
  }
  *puVar1 = (uint8_t)sequence;
  puVar2 = puVar1 + 1;
  if (0x3f < packet_tolerance) {
    if (packet_tolerance < 0x4000) {
      puVar1[1] = (byte)(packet_tolerance >> 8) | 0x40;
      puVar2 = puVar1 + 2;
    }
    else {
      quicly_encode_ack_frequency_frame_cold_2();
      puVar2 = in_RAX;
    }
  }
  *puVar2 = (uint8_t)packet_tolerance;
  puVar1 = puVar2 + 1;
  if (0x3f < max_ack_delay) {
    if (max_ack_delay < 0x4000) {
      puVar2[1] = (byte)(max_ack_delay >> 8) | 0x40;
      puVar1 = puVar2 + 2;
    }
    else {
      quicly_encode_ack_frequency_frame_cold_3();
      puVar1 = in_RAX;
    }
  }
  *puVar1 = (uint8_t)max_ack_delay;
  puVar1[1] = '\0';
  return puVar1 + 2;
}

Assistant:

inline uint8_t *quicly_encode_ack_frequency_frame(uint8_t *dst, uint64_t sequence, uint64_t packet_tolerance,
                                                  uint64_t max_ack_delay, int ignore_order)
{
    dst = quicly_encodev(dst, QUICLY_FRAME_TYPE_ACK_FREQUENCY);
    dst = quicly_encodev(dst, sequence);
    dst = quicly_encodev(dst, packet_tolerance);
    dst = quicly_encodev(dst, max_ack_delay);
    *dst++ = !!ignore_order;
    return dst;
}